

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::VideoTrack::SetColour(VideoTrack *this,Colour *colour)

{
  Colour *this_00;
  uint64_t uVar1;
  bool bVar2;
  Colour *this_01;
  pointer *__ptr;
  unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> colour_ptr;
  Colour *local_18;
  
  this_01 = (Colour *)operator_new(0x70);
  *(undefined4 *)&this_01->matrix_coefficients_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->matrix_coefficients_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->bits_per_channel_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->bits_per_channel_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->chroma_subsampling_horz_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->chroma_subsampling_horz_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->chroma_subsampling_vert_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->chroma_subsampling_vert_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->cb_subsampling_horz_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->cb_subsampling_horz_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->cb_subsampling_vert_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->cb_subsampling_vert_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->chroma_siting_horz_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->chroma_siting_horz_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->chroma_siting_vert_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->chroma_siting_vert_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->range_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->range_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->transfer_characteristics_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->transfer_characteristics_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->primaries_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->primaries_ + 4) = 0xffffffff;
  *(undefined4 *)&this_01->max_cll_ = 0xffffffff;
  *(undefined4 *)((long)&this_01->max_cll_ + 4) = 0xffffffff;
  this_01->max_fall_ = 0xffffffffffffffff;
  this_01->mastering_metadata_ = (MasteringMetadata *)0x0;
  if (colour->mastering_metadata_ != (MasteringMetadata *)0x0) {
    bVar2 = Colour::SetMasteringMetadata(this_01,colour->mastering_metadata_);
    if (!bVar2) {
      bVar2 = false;
      local_18 = this_01;
      goto LAB_00152759;
    }
  }
  uVar1 = colour->bits_per_channel_;
  this_01->matrix_coefficients_ = colour->matrix_coefficients_;
  this_01->bits_per_channel_ = uVar1;
  uVar1 = colour->chroma_subsampling_vert_;
  this_01->chroma_subsampling_horz_ = colour->chroma_subsampling_horz_;
  this_01->chroma_subsampling_vert_ = uVar1;
  uVar1 = colour->cb_subsampling_vert_;
  this_01->cb_subsampling_horz_ = colour->cb_subsampling_horz_;
  this_01->cb_subsampling_vert_ = uVar1;
  uVar1 = colour->chroma_siting_vert_;
  this_01->chroma_siting_horz_ = colour->chroma_siting_horz_;
  this_01->chroma_siting_vert_ = uVar1;
  uVar1 = colour->transfer_characteristics_;
  this_01->range_ = colour->range_;
  this_01->transfer_characteristics_ = uVar1;
  uVar1 = colour->max_cll_;
  this_01->primaries_ = colour->primaries_;
  this_01->max_cll_ = uVar1;
  this_01->max_fall_ = colour->max_fall_;
  this_00 = this->colour_;
  if (this_00 != (Colour *)0x0) {
    Colour::~Colour(this_00);
    operator_delete(this_00);
  }
  local_18 = (Colour *)0x0;
  this->colour_ = this_01;
  bVar2 = true;
LAB_00152759:
  if (local_18 != (Colour *)0x0) {
    Colour::~Colour(local_18);
    operator_delete(local_18);
  }
  return bVar2;
}

Assistant:

bool VideoTrack::SetColour(const Colour& colour) {
  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  if (colour.mastering_metadata()) {
    if (!colour_ptr->SetMasteringMetadata(*colour.mastering_metadata()))
      return false;
  }

  colour_ptr->set_matrix_coefficients(colour.matrix_coefficients());
  colour_ptr->set_bits_per_channel(colour.bits_per_channel());
  colour_ptr->set_chroma_subsampling_horz(colour.chroma_subsampling_horz());
  colour_ptr->set_chroma_subsampling_vert(colour.chroma_subsampling_vert());
  colour_ptr->set_cb_subsampling_horz(colour.cb_subsampling_horz());
  colour_ptr->set_cb_subsampling_vert(colour.cb_subsampling_vert());
  colour_ptr->set_chroma_siting_horz(colour.chroma_siting_horz());
  colour_ptr->set_chroma_siting_vert(colour.chroma_siting_vert());
  colour_ptr->set_range(colour.range());
  colour_ptr->set_transfer_characteristics(colour.transfer_characteristics());
  colour_ptr->set_primaries(colour.primaries());
  colour_ptr->set_max_cll(colour.max_cll());
  colour_ptr->set_max_fall(colour.max_fall());
  delete colour_;
  colour_ = colour_ptr.release();
  return true;
}